

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_validation.cpp
# Opt level: O1

XrResult CoreValidationXrSetDebugUtilsObjectNameEXT
                   (XrInstance instance,XrDebugUtilsObjectNameInfoEXT *nameInfo)

{
  XrObjectType object_type;
  uint64_t object_handle;
  XrResult XVar1;
  pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> info_with_lock;
  allocator local_59;
  string local_58;
  pair<std::unique_lock<std::mutex>,_GenValidUsageXrInstanceInfo_*> local_38;
  
  XVar1 = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance,nameInfo);
  if (XVar1 == XR_SUCCESS) {
    XVar1 = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance,nameInfo);
    if (XVar1 == XR_SUCCESS) {
      HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::getWithLock
                (&local_38,
                 &g_instance_info.super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,
                 instance);
      if (local_38.second != (GenValidUsageXrInstanceInfo *)0x0) {
        object_handle = nameInfo->objectHandle;
        object_type = nameInfo->objectType;
        std::__cxx11::string::string((string *)&local_58,nameInfo->objectName,&local_59);
        DebugUtilsData::AddObjectName
                  (&(local_38.second)->debug_data,object_handle,object_type,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_38.first);
      XVar1 = XR_SUCCESS;
    }
  }
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL CoreValidationXrSetDebugUtilsObjectNameEXT(XrInstance instance,
                                                                          const XrDebugUtilsObjectNameInfoEXT *nameInfo) {
    try {
        XrResult result = GenValidUsageInputsXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        result = GenValidUsageNextXrSetDebugUtilsObjectNameEXT(instance, nameInfo);
        if (!XR_UNQUALIFIED_SUCCESS(result)) {
            return result;
        }
        auto info_with_lock = g_instance_info.getWithLock(instance);
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_lock.second;
        if (nullptr != gen_instance_info) {
            gen_instance_info->debug_data.AddObjectName(nameInfo->objectHandle, nameInfo->objectType, nameInfo->objectName);
        }
        return result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}